

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int Curl_strcasecompare(char *first,char *second)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  while( true ) {
    uVar3 = (ulong)(byte)first[lVar2];
    bVar1 = second[lVar2];
    if ((uVar3 == 0) || (bVar1 == 0)) break;
    if (""[uVar3] != ""[bVar1]) {
      return 0;
    }
    lVar2 = lVar2 + 1;
  }
  return (int)(((ulong)bVar1 != 0) != (uVar3 == 0));
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      return 0;
    first++;
    second++;
  }
  /* If we're here either the strings are the same or the length is different.
     We can just test if the "current" character is non-zero for one and zero
     for the other. Note that the characters may not be exactly the same even
     if they match, we only want to compare zero-ness. */
  return !*first == !*second;
}